

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::DragBehaviorT<unsigned_long_long,long_long,double>
               (ImGuiDataType data_type,unsigned_long_long *v,float v_speed,unsigned_long_long v_min
               ,unsigned_long_long v_max,char *format,ImGuiSliderFlags flags)

{
  unsigned_long_long v_00;
  ulong uVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  ImGuiInputSource IVar6;
  uint uVar7;
  int iVar8;
  ImGuiKey IVar9;
  ulong uVar10;
  ImGuiAxis axis;
  float fVar11;
  float fVar12;
  float fVar13;
  float local_78;
  
  pIVar2 = GImGui;
  uVar10 = v_max - v_min;
  if (v_speed == 0.0 && (v_min <= v_max && uVar10 != 0)) {
    v_speed = (float)uVar10 * GImGui->DragSpeedDefaultRatio;
  }
  axis = (flags & 0x100000U) >> 0x14;
  uVar5 = data_type & 0xfffffffe;
  IVar6 = GImGui->ActiveIdSource;
  if (IVar6 == ImGuiInputSource_Mouse) {
    bVar3 = IsMousePosValid((ImVec2 *)0x0);
    if ((!bVar3) ||
       (bVar3 = IsMouseDragPastThreshold(0,(pIVar2->IO).MouseDragThreshold * 0.5), !bVar3)) {
      IVar6 = pIVar2->ActiveIdSource;
      goto LAB_00226747;
    }
    fVar13 = (float)(pIVar2->IO).KeyMap[(ulong)(uint)axis - 2];
    if ((pIVar2->IO).KeyAlt != false) {
      fVar13 = fVar13 * 0.01;
    }
    if ((pIVar2->IO).KeyShift == true) {
      fVar13 = fVar13 * 10.0;
    }
  }
  else {
LAB_00226747:
    fVar13 = 0.0;
    if (IVar6 == ImGuiInputSource_Nav) {
      uVar7 = 0;
      if (uVar5 == 8) {
        uVar7 = ImParseFormatPrecision(format,3);
      }
      IVar9 = ImGuiKey_ModCtrl;
      if (pIVar2->NavInputSource == ImGuiInputSource_Gamepad) {
        IVar9 = ImGuiKey_GamepadL1;
      }
      bVar3 = IsKeyDown(IVar9);
      IVar9 = ImGuiKey_ModShift;
      if (pIVar2->NavInputSource == ImGuiInputSource_Gamepad) {
        IVar9 = ImGuiKey_GamepadR1;
      }
      bVar4 = IsKeyDown(IVar9);
      if (bVar4) {
        fVar13 = 10.0;
      }
      else {
        fVar13 = 1.0;
      }
      fVar12 = 1.0;
      if (!bVar3) {
        fVar12 = fVar13;
      }
      fVar13 = GetNavTweakPressedAmount(axis);
      if ((int)uVar7 < 0) {
        fVar11 = 1.1754944e-38;
      }
      else if (uVar7 < 10) {
        fVar11 = *(float *)(GetMinimumStepAtDecimalPrecision(int)::min_steps + (ulong)uVar7 * 4);
      }
      else {
        fVar11 = powf(10.0,(float)(int)-uVar7);
      }
      fVar13 = fVar13 * fVar12;
      v_speed = (float)((uint)v_speed & -(uint)(fVar11 <= v_speed) |
                       ~-(uint)(fVar11 <= v_speed) & (uint)fVar11);
    }
  }
  fVar13 = fVar13 * v_speed;
  if ((flags & 0x100000U) != 0) {
    fVar13 = -fVar13;
  }
  fVar12 = fVar13;
  if ((flags & 0x20U) != 0) {
    fVar12 = fVar13 / (float)uVar10;
  }
  bVar3 = false;
  if (v_max != v_min) {
    fVar13 = fVar12;
  }
  if (v_min < v_max) {
    if ((v_max <= *v) && (0.0 < fVar13)) goto LAB_00226904;
    bVar3 = fVar13 < 0.0 && *v <= v_min;
  }
  if ((pIVar2->ActiveIdIsJustActivated == false) && (!bVar3)) {
    if ((fVar13 != 0.0) || (NAN(fVar13))) {
      pIVar2->DragCurrentAccum = pIVar2->DragCurrentAccum + fVar13;
      pIVar2->DragCurrentAccumDirty = true;
    }
    else if ((pIVar2->DragCurrentAccumDirty & 1U) == 0) {
      return false;
    }
    v_00 = *v;
    if ((flags & 0x20U) == 0) {
      uVar10 = v_00 + (long)pIVar2->DragCurrentAccum;
      local_78 = 0.0;
      fVar12 = 0.0;
    }
    else {
      if (uVar5 == 8) {
        iVar8 = ImParseFormatPrecision(format,3);
        fVar12 = (float)iVar8;
      }
      else {
        fVar12 = 1.0;
      }
      local_78 = powf(0.1,fVar12);
      fVar12 = ScaleRatioFromValueT<unsigned_long_long,long_long,double>
                         (data_type,v_00,v_min,v_max,true,local_78,0.0);
      uVar10 = ScaleValueFromRatioT<unsigned_long_long,long_long,double>
                         (data_type,pIVar2->DragCurrentAccum + fVar12,v_min,v_max,true,local_78,0.0)
      ;
    }
    if ((flags & 0x40U) == 0 && uVar5 == 8) {
      uVar10 = RoundScalarWithFormatT<unsigned_long_long>(format,data_type,uVar10);
    }
    pIVar2->DragCurrentAccumDirty = false;
    if ((flags & 0x20U) == 0) {
      fVar11 = (float)(long)(uVar10 - *v);
    }
    else {
      fVar11 = ScaleRatioFromValueT<unsigned_long_long,long_long,double>
                         (data_type,uVar10,v_min,v_max,true,local_78,0.0);
      fVar11 = fVar11 - fVar12;
    }
    pIVar2->DragCurrentAccum = pIVar2->DragCurrentAccum - fVar11;
    uVar1 = *v;
    if ((v_min < v_max) && (uVar1 != uVar10)) {
      if ((uVar10 < v_min) || (((uVar5 != 8 && (uVar1 < uVar10)) && (fVar13 < 0.0)))) {
        uVar10 = v_min;
      }
      if ((v_max < uVar10) || (((uVar5 != 8 && (uVar10 < uVar1)) && (0.0 < fVar13)))) {
        uVar10 = v_max;
      }
    }
    if (uVar1 == uVar10) {
      return false;
    }
    *v = uVar10;
    return true;
  }
LAB_00226904:
  pIVar2->DragCurrentAccum = 0.0;
  pIVar2->DragCurrentAccumDirty = false;
  return false;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_clamped = (v_min < v_max);
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) != 0;
    const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);

    // Default tweak speed
    if (v_speed == 0.0f && is_clamped && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && IsMouseDragPastThreshold(0, g.IO.MouseDragThreshold * DRAG_MOUSE_THRESHOLD_FACTOR))
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Nav)
    {
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 0;
        const bool tweak_slow = IsKeyDown((g.NavInputSource == ImGuiInputSource_Gamepad) ? ImGuiKey_NavGamepadTweakSlow : ImGuiKey_NavKeyboardTweakSlow);
        const bool tweak_fast = IsKeyDown((g.NavInputSource == ImGuiInputSource_Gamepad) ? ImGuiKey_NavGamepadTweakFast : ImGuiKey_NavKeyboardTweakFast);
        const float tweak_factor = tweak_slow ? 1.0f / 1.0f : tweak_fast ? 10.0f : 1.0f;
        adjust_delta = GetNavTweakPressedAmount(axis) * tweak_factor;
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // For logarithmic use our range is effectively 0..1 so scale the delta into that range
    if (is_logarithmic && (v_max - v_min < FLT_MAX) && ((v_max - v_min) > 0.000001f)) // Epsilon to avoid /0
        adjust_delta /= (float)(v_max - v_min);

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    bool is_just_activated = g.ActiveIdIsJustActivated;
    bool is_already_past_limits_and_pushing_outward = is_clamped && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    if (is_just_activated || is_already_past_limits_and_pushing_outward)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    const float zero_deadzone_halfsize = 0.0f; // Drag widgets have no deadzone (as it doesn't make sense)
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);

        // Convert to parametric space, apply delta, convert back
        float v_old_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        float v_new_parametric = v_old_parametric + g.DragCurrentAccum;
        v_cur = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new_parametric, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        v_old_ref_for_accum_remainder = v_old_parametric;
    }
    else
    {
        v_cur += (SIGNEDTYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    if (is_floating_point && !(flags & ImGuiSliderFlags_NoRoundToFormat))
        v_cur = RoundScalarWithFormatT<TYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_logarithmic)
    {
        // Convert to parametric space, apply delta, convert back
        float v_new_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        g.DragCurrentAccum -= (float)(v_new_parametric - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    // Clamp values (+ handle overflow/wrap-around for integer types)
    if (*v != v_cur && is_clamped)
    {
        if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_floating_point))
            v_cur = v_min;
        if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_floating_point))
            v_cur = v_max;
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}